

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator>
* __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
::equal_range<phmap::priv::NonStandardLayout>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator>
           *__return_storage_ptr__,
          parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
          *this,key_arg<phmap::priv::NonStandardLayout> *key)

{
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator>
  *ppVar1;
  iterator it;
  iterator local_78;
  iterator local_48;
  
  find<phmap::priv::NonStandardLayout>(&local_78,this,key);
  if (local_78.inner_ == (Inner *)0x0) {
    (__return_storage_ptr__->first).it_end_.ctrl_ = local_78.it_end_.ctrl_;
    (__return_storage_ptr__->first).it_end_.field_1 = local_78.it_end_.field_1;
    (__return_storage_ptr__->first).it_.ctrl_ = local_78.it_.ctrl_;
    (__return_storage_ptr__->first).it_.field_1 = local_78.it_.field_1;
    (__return_storage_ptr__->first).inner_ = (Inner *)0x0;
    (__return_storage_ptr__->first).inner_end_ = local_78.inner_end_;
    ppVar1 = (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator>
              *)&__return_storage_ptr__->second;
  }
  else {
    local_48.it_end_.ctrl_ = local_78.it_end_.ctrl_;
    local_48.it_end_.field_1 = local_78.it_end_.field_1;
    local_48.it_.ctrl_ = local_78.it_.ctrl_;
    local_48.it_.field_1 = local_78.it_.field_1;
    local_48.inner_ = local_78.inner_;
    local_48.inner_end_ = local_78.inner_end_;
    iterator::operator++(&local_48);
    (__return_storage_ptr__->second).inner_ = local_48.inner_;
    (__return_storage_ptr__->second).inner_end_ = local_48.inner_end_;
    (__return_storage_ptr__->second).it_.ctrl_ = local_48.it_.ctrl_;
    (__return_storage_ptr__->second).it_.field_1 = local_48.it_.field_1;
    (__return_storage_ptr__->second).it_end_.ctrl_ = local_48.it_end_.ctrl_;
    (__return_storage_ptr__->second).it_end_.field_1 = local_48.it_end_.field_1;
    ppVar1 = __return_storage_ptr__;
  }
  (ppVar1->first).it_end_.ctrl_ = local_78.it_end_.ctrl_;
  (ppVar1->first).it_end_.field_1 = local_78.it_end_.field_1;
  (ppVar1->first).it_.ctrl_ = local_78.it_.ctrl_;
  (ppVar1->first).it_.field_1 = local_78.it_.field_1;
  (ppVar1->first).inner_ = local_78.inner_;
  (ppVar1->first).inner_end_ = local_78.inner_end_;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_arg<K>& key) {
        auto it = find(key);
        if (it != end()) return {it, std::next(it)};
        return {it, it};
    }